

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

void __thiscall
TxRequestTracker::Impl::ReceivedInv
          (Impl *this,NodeId peer,GenTxid *gtxid,bool preferred,microseconds reqtime)

{
  type *ptVar1;
  size_type *psVar2;
  long lVar3;
  pointer poVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  weak_ordering wVar12;
  bool bVar13;
  ulong uVar14;
  Announcement *ann;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar15;
  mapped_type *pmVar16;
  ulong uVar17;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar18;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar19;
  Announcement *ann_00;
  pointer *ppoVar20;
  long lVar21;
  long in_FS_OFFSET;
  result_type rVar22;
  uint256 *local_90;
  rep local_88;
  NodeId local_80;
  NodeId peer_local;
  link_info inf;
  link_info inf_2;
  link_info inf_1;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = CONCAT71(local_88._1_7_,1);
  poVar18 = (this->m_index).
            super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
            .member;
  uVar14 = (poVar18->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.parentcolor_ & 0xfffffffffffffffe;
  poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)(uVar14 - 0x68);
  if (uVar14 == 0) {
    poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
  }
  ptVar1 = &(this->m_index).super_type;
  local_90 = &gtxid->m_hash;
  local_80 = peer;
  peer_local = peer;
LAB_00358819:
  inf_2._0_8_ = poVar18;
  if (poVar19 ==
      (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
       *)0x0) goto LAB_003588a6;
  inf_2.pos._0_1_ =
       (*(ulong *)((long)&(poVar19->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          .
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) & 0xe000000000000000) == 0x4000000000000000;
  inf_2._0_8_ = poVar19;
  wVar12 = std::
           __tuple_cmp<std::weak_ordering,std::tuple<long,bool,uint256_const&>,std::tuple<long,bool,uint256_const&>,0ul,1ul,2ul>
                     (&inf_2,&local_90);
  if (wVar12._M_value < '\0') {
    lVar21 = 0x78;
    poVar15 = poVar18;
  }
  else {
    inf_2.pos._0_1_ =
         (*(ulong *)((long)&(poVar19->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            .
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x30) & 0xe000000000000000) == 0x4000000000000000;
    inf_2._0_8_ = poVar19;
    wVar12 = std::
             __tuple_cmp<std::weak_ordering,std::tuple<long,bool,uint256_const&>,std::tuple<long,bool,uint256_const&>,0ul,1ul,2ul>
                       (&local_90,&inf_2);
    lVar21 = 0x70;
    poVar15 = poVar19;
    if (-1 < wVar12._M_value) {
      poVar4 = (poVar19->
               super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               ).
               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.left_;
      ppoVar20 = &poVar4[-5].
                  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                  .super_type.right_;
      if (poVar4 == (pointer)0x0) {
        ppoVar20 = (pointer *)0x0;
      }
      poVar15 = boost::multi_index::detail::
                ordered_index_lower_bound<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>,(anonymous_namespace)::ByPeerViewExtractor,std::tuple<long,bool,uint256_const&>,std::less<std::tuple<long,bool,uint256_const&>>>
                          (ppoVar20,poVar19,&local_90);
      poVar4 = (poVar19->
               super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               ).
               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.right_;
      poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)&poVar4[-5].
                    super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                    .super_type.right_;
      if (poVar4 == (pointer)0x0) {
        poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)0x0;
      }
      while (inf_2._0_8_ = poVar15,
            poVar19 !=
            (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)0x0) {
        inf_2.pos._0_1_ =
             (*(ulong *)((long)&(poVar19->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                .
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30) & 0xe000000000000000) == 0x4000000000000000;
        inf_2._0_8_ = poVar19;
        wVar12 = std::
                 __tuple_cmp<std::weak_ordering,std::tuple<long,bool,uint256_const&>,std::tuple<long,bool,uint256_const&>,0ul,1ul,2ul>
                           (&local_90,&inf_2);
        if (-1 >= wVar12._M_value) {
          poVar18 = poVar19;
        }
        poVar4 = (&(poVar19->
                   super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   ).
                   super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                   .
                   super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                   .super_type.left_)[-1 < wVar12._M_value];
        poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)((long)(poVar4 + 0xfffffffffffffffb) + 0x10);
        if (poVar4 == (pointer)0x0) {
          poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                     *)0x0;
        }
      }
LAB_003588a6:
      lVar21 = 0;
      while ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
              *)inf_2._0_8_ != poVar18) {
        boost::multi_index::detail::
        ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
        ::increment((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                     **)&inf_2);
        lVar21 = lVar21 + -1;
      }
      if (lVar21 == 0) {
        ann = (Announcement *)operator_new(0x80);
        uVar5 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 4);
        uVar6 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0xc);
        uVar8 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
        uVar9 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x14);
        uVar10 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar11 = *(undefined4 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x1c);
        uVar14 = this->m_current_sequence;
        *(undefined4 *)(ann->m_txhash).super_base_blob<256U>.m_data._M_elems =
             *(undefined4 *)(gtxid->m_hash).super_base_blob<256U>.m_data._M_elems;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 4) = uVar5;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar7;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar8;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar9;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar10;
        *(undefined4 *)((ann->m_txhash).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar11;
        (ann->m_time).__r = reqtime.__r;
        ann->m_peer = peer;
        uVar17 = 0;
        if (preferred) {
          uVar17 = 0x800000000000000;
        }
        *(ulong *)&ann->field_0x30 =
             uVar17 | uVar14 & 0x7ffffffffffffff | (ulong)gtxid->m_is_wtxid << 0x3c;
        inf.side = to_left;
        inf_2.pos._0_1_ = 0;
        inf_2._0_8_ = ann;
        bVar13 = boost::multi_index::detail::
                 ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 ::link_point(&ptVar1->super_type);
        if (bVar13) {
          inf_1.side = to_left;
          anon_unknown.dwarf_b8b207::ByTxHashViewExtractor::operator()
                    ((result_type *)&inf_2,
                     (ByTxHashViewExtractor *)&(this->m_index).super_type.super_type.field_0x8,ann);
          ann_00 = (Announcement *)&inf_2;
          boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::link_point((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)ptVar1,ann_00,&inf_1);
          inf_2._0_8_ = inf_2._0_8_ & 0xffffffff00000000;
          rVar22 = anon_unknown.dwarf_b8b207::ByTimeViewExtractor::operator()
                             ((ByTimeViewExtractor *)ann,ann_00);
          local_88 = (rep)rVar22.second.__r;
          local_90 = (uint256 *)CONCAT44(local_90._4_4_,rVar22.first);
          boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::link_point((ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)ptVar1,&local_90,&inf_2);
          boost::multi_index::detail::
          ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
          ::link((char *)(ann + 1),(char *)(inf_2._0_8_ & 0xffffffff));
          boost::multi_index::detail::
          ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
          ::link((char *)(ann[1].m_txhash.super_base_blob<256U>.m_data._M_elems + 0x18),
                 (char *)(ulong)inf_1.side);
          boost::multi_index::detail::
          ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
          ::link(&ann[1].field_0x30,(char *)(ulong)inf.side);
        }
        else if (inf.pos == (node_impl_pointer)0x0 ||
                 (Announcement *)
                 &inf.pos[-5].
                  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                  .super_type.right_ != ann) {
          operator_delete(ann,0x80);
          goto LAB_00358adc;
        }
        psVar2 = &(this->m_index).node_count;
        *psVar2 = *psVar2 + 1;
        pmVar16 = std::
                  unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                  ::operator[](&this->m_peerinfo,&peer_local);
        pmVar16->m_total = pmVar16->m_total + 1;
        this->m_current_sequence = this->m_current_sequence + 1;
      }
LAB_00358adc:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
        __stack_chk_fail();
      }
      return;
    }
  }
  lVar21 = *(long *)((long)&(poVar19->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            .
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + lVar21);
  poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)(lVar21 + -0x68);
  poVar18 = poVar15;
  if (lVar21 == 0) {
    poVar19 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
  }
  goto LAB_00358819;
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool preferred,
        std::chrono::microseconds reqtime)
    {
        // Bail out if we already have a CANDIDATE_BEST announcement for this (txhash, peer) combination. The case
        // where there is a non-CANDIDATE_BEST announcement already will be caught by the uniqueness property of the
        // ByPeer index when we try to emplace the new object below.
        if (m_index.get<ByPeer>().count(ByPeerView{peer, true, gtxid.GetHash()})) return;

        // Try creating the announcement with CANDIDATE_DELAYED state (which will fail due to the uniqueness
        // of the ByPeer index if a non-CANDIDATE_BEST announcement already exists with the same txhash and peer).
        // Bail out in that case.
        auto ret = m_index.get<ByPeer>().emplace(gtxid, peer, preferred, reqtime, m_current_sequence);
        if (!ret.second) return;

        // Update accounting metadata.
        ++m_peerinfo[peer].m_total;
        ++m_current_sequence;
    }